

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

mg_connection * mg_next(mg_server *s,mg_connection *c)

{
  ns_connection *pnVar1;
  ns_connection *local_38;
  ns_connection *nc;
  mg_connection *c_local;
  mg_server *s_local;
  
  if (c == (mg_connection *)0x0) {
    local_38 = (ns_connection *)0x0;
  }
  else {
    local_38 = (ns_connection *)c[-1].callback_param;
  }
  pnVar1 = ns_next(&s->ns_mgr,local_38);
  if ((pnVar1 == (ns_connection *)0x0) || (pnVar1->user_data == (void *)0x0)) {
    s_local = (mg_server *)0x0;
  }
  else {
    s_local = (mg_server *)((long)pnVar1->user_data + 8);
  }
  return (mg_connection *)s_local;
}

Assistant:

struct mg_connection *mg_next(struct mg_server *s, struct mg_connection *c) {
  struct ns_connection *nc = ns_next(&s->ns_mgr, c == NULL ? NULL :
                                     MG_CONN_2_CONN(c)->ns_conn);
  if (nc != NULL && nc->user_data != NULL) {
    return & ((struct connection *) nc->user_data)->mg_conn;
  } else {
    return NULL;
  }
}